

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Repetition.hpp
# Opt level: O2

void InstructionSet::x86::Primitive::
     outs<unsigned_char,unsigned_short,(InstructionSet::x86::Repetition)0,InstructionSet::x86::Instruction<false>,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
               (Instruction<false> *instruction,unsigned_short *eCX,uint16_t port,
               unsigned_short *eSI,Context *context)

{
  type_conflict3 value;
  
  value = PCCompatible::Memory::access<unsigned_char,(InstructionSet::x86::AccessType)0>
                    (&context->memory,(Source)(instruction->source_data_dest_sib_ >> 10) & BH | ES,
                     *eSI);
  PCCompatible::IO<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::out<unsigned_char>
            (&context->io,port,value);
  *eSI = *eSI + (short)(context->flags).direction_;
  return;
}

Assistant:

void outs(
	const InstructionT &instruction,
	AddressT &eCX,
	uint16_t port,
	AddressT &eSI,
	ContextT &context
) {
	if(repetition_over<AddressT, repetition>(eCX)) {
		return;
	}

	context.io.template out<IntT>(
		port,
		context.memory.template access<IntT, AccessType::Read>(instruction.data_segment(), eSI)
	);
	eSI += context.flags.template direction<AddressT>() * sizeof(IntT);

	repeat<AddressT, repetition>(eCX, context);
}